

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compositecodec.h
# Opt level: O3

uint32_t * __thiscall
FastPForLib::
CompositeCodec<FastPForLib::OPTPFor<4U,_FastPForLib::Simple16<false>_>,_FastPForLib::VariableByte>::
_decodeArray<unsigned_long>
          (CompositeCodec<FastPForLib::OPTPFor<4U,_FastPForLib::Simple16<false>_>,_FastPForLib::VariableByte>
           *this,uint32_t *in,size_t length,unsigned_long *out,size_t *nvalue)

{
  uint32_t *puVar1;
  uint32_t *inbyte;
  logic_error *this_00;
  size_t sVar2;
  long lVar3;
  size_t mynvalue1;
  size_t nvalue2;
  ulong local_48;
  uint32_t *local_40;
  size_t local_38;
  
  local_48 = *nvalue;
  if (local_48 == 0) {
    return in;
  }
  inbyte = IntegerCODEC::decodeArray((IntegerCODEC *)&this->codec1,in,length,out,&local_48);
  puVar1 = in + length;
  if (inbyte < puVar1) {
    sVar2 = *nvalue - local_48;
    local_40 = puVar1;
    if (*nvalue < local_48 || sVar2 == 0) {
      this_00 = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error(this_00,"Buffer contains more data than requested!");
    }
    else {
      lVar3 = length - ((ulong)((long)inbyte - (long)in) >> 2);
      local_38 = sVar2;
      VariableByte::decodeFromByteArray<unsigned_long>
                (&this->codec2,(uint8_t *)inbyte,lVar3 * 4,out + local_48,&local_38);
      *nvalue = local_38 + local_48;
      if (inbyte + lVar3 <= local_40) {
        return inbyte + lVar3;
      }
      this_00 = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error
                (this_00,"Decode run over output buffer. Potential buffer overflow!");
    }
  }
  else {
    *nvalue = local_48;
    if (inbyte <= puVar1) {
      return inbyte;
    }
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error
              (this_00,"Decode run over output buffer. Potential buffer overflow!");
  }
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

const uint32_t *_decodeArray(const uint32_t *in, const size_t length,
                               IntType *out, size_t &nvalue) {
    if (nvalue == 0) {
      return in;
    }
    const uint32_t *const initin(in);
    size_t mynvalue1 = nvalue;
    const uint32_t *in2 = codec1.decodeArray(in, length, out, mynvalue1);
    if (length + in > in2) {
      if (nvalue <= mynvalue1) {
        throw std::logic_error("Buffer contains more data than requested!");
      }
      size_t nvalue2 = nvalue - mynvalue1;
      const uint32_t *in3 = codec2.decodeArray(in2, length - (in2 - in),
                                               out + mynvalue1, nvalue2);
      nvalue = mynvalue1 + nvalue2;
      if (initin + length < in3) {
        throw std::logic_error(
            "Decode run over output buffer. Potential buffer overflow!");
      }
      return in3;
    }
    nvalue = mynvalue1;
    if (initin + length < in2) {
      throw std::logic_error(
          "Decode run over output buffer. Potential buffer overflow!");
    }
    return in2;
  }